

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O0

int beast::lexicalCastThrow<int,char*>(char *in)

{
  bool bVar1;
  BadLexicalCast *this;
  int local_14;
  char *pcStack_10;
  int out;
  char *in_local;
  
  pcStack_10 = in;
  bVar1 = lexicalCastChecked<int,char*>(&local_14,in);
  if (!bVar1) {
    this = (BadLexicalCast *)__cxa_allocate_exception(8);
    memset(this,0,8);
    BadLexicalCast::BadLexicalCast(this);
    __cxa_throw(this,&BadLexicalCast::typeinfo,BadLexicalCast::~BadLexicalCast);
  }
  return local_14;
}

Assistant:

Out lexicalCastThrow (In in)
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    throw BadLexicalCast ();
}